

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab9.c
# Opt level: O0

int feederBig1(void)

{
  FILE *__stream;
  int local_1c;
  int i;
  FILE *in;
  
  __stream = fopen("in.txt","w+");
  if (__stream == (FILE *)0x0) {
    printf("can\'t create in.txt. No space on disk?\n");
    in._4_4_ = -1;
  }
  else {
    fprintf(__stream,"5000\n1 2501\n5000\n");
    for (local_1c = 0; local_1c < 4999; local_1c = local_1c + 1) {
      fprintf(__stream,"%d %d 1\n",(ulong)(local_1c + 1),(ulong)(local_1c + 2));
    }
    fprintf(__stream,"5000 1 1\n");
    fclose(__stream);
    LabMemoryLimit = 0x635e100;
    in._4_4_ = 0;
  }
  return in._4_4_;
}

Assistant:

static int feederBig1(void)
{
    FILE *const in = fopen("in.txt", "w+");
    int i;
    if (!in) {
        printf("can't create in.txt. No space on disk?\n");
        return -1;
    }
    fprintf(in, "5000\n1 2501\n5000\n");
    for (i = 0; i < 4999; i++) {
        fprintf(in, "%d %d 1\n", i+1, i+2);
    }
    fprintf(in, "5000 1 1\n");
    fclose(in);
    LabMemoryLimit = 5000*5000*4+MIN_PROCESS_RSS_BYTES;
    return 0;
}